

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::FileDescriptorTest_Edition_Test::TestBody
          (FileDescriptorTest_Edition_Test *this)

{
  bool bVar1;
  uint32_t *puVar2;
  Arena *pAVar3;
  char *pcVar4;
  string *psVar5;
  char *in_R9;
  AssertHelper local_880;
  Message local_878;
  Edition local_870;
  Edition local_86c;
  undefined1 local_868 [8];
  AssertionResult gtest_ar_6;
  Message local_850;
  undefined1 local_848 [8];
  AssertionResult gtest_ar_5;
  FileDescriptorProto other_2;
  Message local_738;
  Edition local_72c;
  FileDescriptorLegacy local_728;
  Edition local_71c;
  undefined1 local_718 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_6e8;
  Message local_6e0;
  bool local_6d1;
  undefined1 local_6d0 [8];
  AssertionResult gtest_ar__4;
  FileDescriptor *file_2;
  DescriptorPool pool_2;
  AssertHelper local_620;
  Message local_618;
  bool local_609;
  undefined1 local_608 [8];
  AssertionResult gtest_ar__3;
  Message local_5f0;
  undefined1 local_5e8 [8];
  AssertionResult gtest_ar_3;
  FileDescriptorProto other_1;
  Message local_4d8;
  Edition local_4cc;
  FileDescriptorLegacy local_4c8;
  Edition local_4bc;
  undefined1 local_4b8 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_488;
  Message local_480;
  bool local_471;
  undefined1 local_470 [8];
  AssertionResult gtest_ar__2;
  FileDescriptor *file_1;
  DescriptorPool pool_1;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__1;
  Message local_390;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_1;
  FileDescriptorProto other;
  Message local_278;
  Edition local_26c;
  FileDescriptorLegacy local_268;
  Edition local_25c;
  undefined1 local_258 [8];
  AssertionResult gtest_ar;
  string local_240;
  AssertHelper local_220;
  Message local_218;
  bool local_209;
  undefined1 local_208 [8];
  AssertionResult gtest_ar_;
  FileDescriptor *file;
  DescriptorPool pool;
  undefined1 local_168 [8];
  FileDescriptorProto proto;
  FileDescriptorTest_Edition_Test *this_local;
  
  proto.field_0._224_8_ = this;
  FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)local_168);
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
  internal::ArenaStringPtr::Set
            ((ArenaStringPtr *)
             &proto.field_0._impl_.option_dependency_.super_RepeatedPtrFieldBase.arena_,"foo",pAVar3
            );
  puVar2 = internal::HasBits<1>::operator[]
                     ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 4;
  pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
  internal::ArenaStringPtr::Set(&proto.field_0._impl_.package_,"proto2",pAVar3);
  DescriptorPool::DescriptorPool((DescriptorPool *)&file);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )DescriptorPool::BuildFile((DescriptorPool *)&file,(FileDescriptorProto *)local_168);
  local_209 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )gtest_ar_.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_208,&local_209,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_208);
  if (!bVar1) {
    testing::Message::Message(&local_218);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)local_208,(AssertionResult *)0x1d2399f,"false","true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_220,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
               ,0x1f9,pcVar4);
    testing::internal::AssertHelper::operator=(&local_220,&local_218);
    testing::internal::AssertHelper::~AssertHelper(&local_220);
    std::__cxx11::string::~string((string *)&local_240);
    testing::Message::~Message(&local_218);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_208);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    FileDescriptorLegacy::FileDescriptorLegacy
              (&local_268,
               (FileDescriptor *)
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl);
    local_25c = FileDescriptorLegacy::edition(&local_268);
    local_26c = EDITION_PROTO2;
    testing::internal::EqHelper::
    Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
              ((EqHelper *)local_258,"FileDescriptorLegacy(file).edition()",
               "Edition::EDITION_PROTO2",&local_25c,&local_26c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
    if (!bVar1) {
      testing::Message::Message(&local_278);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)((long)&other.field_0 + 0xe0),kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fa,pcVar4);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)((long)&other.field_0 + 0xe0),&local_278);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)((long)&other.field_0 + 0xe0));
      testing::Message::~Message(&local_278);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
    FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_1.message_);
    FileDescriptor::CopyTo
              ((FileDescriptor *)
               gtest_ar_.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,(FileDescriptorProto *)&gtest_ar_1.message_);
    psVar5 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)&gtest_ar_1.message_);
    testing::internal::EqHelper::
    Compare<char[1],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_388,"\"\"","other.syntax()",
               (char (*) [1])(anon_var_dwarf_37cdd0 + 5),psVar5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
    if (!bVar1) {
      testing::Message::Message(&local_390);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fd,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_390);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_390);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
    bVar1 = FileDescriptorProto::has_edition((FileDescriptorProto *)&gtest_ar_1.message_);
    local_3a9 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
    if (!bVar1) {
      testing::Message::Message(&local_3b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&pool_1.feature_set_defaults_spec_,(internal *)local_3a8,
                 (AssertionResult *)"other.has_edition()","true","false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_3c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x1fe,pcVar4);
      testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
      testing::internal::AssertHelper::~AssertHelper(&local_3c0);
      std::__cxx11::string::~string((string *)&pool_1.feature_set_defaults_spec_);
      testing::Message::~Message(&local_3b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
    FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_1.message_);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  DescriptorPool::~DescriptorPool((DescriptorPool *)&file);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    puVar2 = internal::HasBits<1>::operator[]
                       ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0);
    *(byte *)puVar2 = (byte)*puVar2 | 4;
    pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
    internal::ArenaStringPtr::Set(&proto.field_0._impl_.package_,"proto3",pAVar3);
    DescriptorPool::DescriptorPool((DescriptorPool *)&file_1);
    gtest_ar__2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )DescriptorPool::BuildFile((DescriptorPool *)&file_1,(FileDescriptorProto *)local_168);
    local_471 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )gtest_ar__2.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl !=
                (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 )0x0;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_470,&local_471,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_470);
    if (!bVar1) {
      testing::Message::Message(&local_480);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_2.message_,(internal *)local_470,(AssertionResult *)0x1d2399f,
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_488,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                 ,0x204,pcVar4);
      testing::internal::AssertHelper::operator=(&local_488,&local_480);
      testing::internal::AssertHelper::~AssertHelper(&local_488);
      std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_480);
    }
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      FileDescriptorLegacy::FileDescriptorLegacy
                (&local_4c8,
                 (FileDescriptor *)
                 gtest_ar__2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl);
      local_4bc = FileDescriptorLegacy::edition(&local_4c8);
      local_4cc = EDITION_PROTO3;
      testing::internal::EqHelper::
      Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
                ((EqHelper *)local_4b8,"FileDescriptorLegacy(file).edition()",
                 "Edition::EDITION_PROTO3",&local_4bc,&local_4cc);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4b8);
      if (!bVar1) {
        testing::Message::Message(&local_4d8);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)((long)&other_1.field_0 + 0xe0),kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x205,pcVar4);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)((long)&other_1.field_0 + 0xe0),&local_4d8);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)((long)&other_1.field_0 + 0xe0));
        testing::Message::~Message(&local_4d8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_4b8);
      FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_3.message_);
      FileDescriptor::CopyTo
                ((FileDescriptor *)
                 gtest_ar__2.message_._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl,(FileDescriptorProto *)&gtest_ar_3.message_);
      psVar5 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)&gtest_ar_3.message_);
      testing::internal::EqHelper::
      Compare<char[7],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_5e8,"\"proto3\"","other.syntax()",(char (*) [7])0x1e1edfb,psVar5)
      ;
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5e8);
      if (!bVar1) {
        testing::Message::Message(&local_5f0);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_5e8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x208,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_5f0)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_5f0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_5e8);
      bVar1 = FileDescriptorProto::has_edition((FileDescriptorProto *)&gtest_ar_3.message_);
      local_609 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_608,&local_609,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_608);
      if (!bVar1) {
        testing::Message::Message(&local_618);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&pool_2.feature_set_defaults_spec_,(internal *)local_608,
                   (AssertionResult *)"other.has_edition()","true","false",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_620,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x209,pcVar4);
        testing::internal::AssertHelper::operator=(&local_620,&local_618);
        testing::internal::AssertHelper::~AssertHelper(&local_620);
        std::__cxx11::string::~string((string *)&pool_2.feature_set_defaults_spec_);
        testing::Message::~Message(&local_618);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_608);
      FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_3.message_);
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
    DescriptorPool::~DescriptorPool((DescriptorPool *)&file_1);
    if (gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      puVar2 = internal::HasBits<1>::operator[]
                         ((HasBits<1> *)&proto.super_Message.super_MessageLite._internal_metadata_,0
                         );
      *(byte *)puVar2 = (byte)*puVar2 | 4;
      pAVar3 = protobuf::MessageLite::GetArena((MessageLite *)local_168);
      internal::ArenaStringPtr::Set(&proto.field_0._impl_.package_,"editions",pAVar3);
      FileDescriptorProto::set_edition((FileDescriptorProto *)local_168,EDITION_2023);
      DescriptorPool::DescriptorPool((DescriptorPool *)&file_2);
      gtest_ar__4.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl =
           (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )DescriptorPool::BuildFile((DescriptorPool *)&file_2,(FileDescriptorProto *)local_168);
      local_6d1 = (tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )gtest_ar__4.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl !=
                  (_Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   )0x0;
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_6d0,&local_6d1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_6d0);
      if (!bVar1) {
        testing::Message::Message(&local_6e0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar_4.message_,(internal *)local_6d0,(AssertionResult *)0x1d2399f
                   ,"false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_6e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                   ,0x210,pcVar4);
        testing::internal::AssertHelper::operator=(&local_6e8,&local_6e0);
        testing::internal::AssertHelper::~AssertHelper(&local_6e8);
        std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
        testing::Message::~Message(&local_6e0);
      }
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_6d0);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        FileDescriptorLegacy::FileDescriptorLegacy
                  (&local_728,
                   (FileDescriptor *)
                   gtest_ar__4.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl);
        local_71c = FileDescriptorLegacy::edition(&local_728);
        local_72c = EDITION_2023;
        testing::internal::EqHelper::
        Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
                  ((EqHelper *)local_718,"FileDescriptorLegacy(file).edition()",
                   "Edition::EDITION_2023",&local_71c,&local_72c);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_718);
        if (!bVar1) {
          testing::Message::Message(&local_738);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_718);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)((long)&other_2.field_0 + 0xe0),kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x211,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)((long)&other_2.field_0 + 0xe0),&local_738);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)((long)&other_2.field_0 + 0xe0));
          testing::Message::~Message(&local_738);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_718);
        FileDescriptorProto::FileDescriptorProto((FileDescriptorProto *)&gtest_ar_5.message_);
        FileDescriptor::CopyTo
                  ((FileDescriptor *)
                   gtest_ar__4.message_._M_t.
                   super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   .
                   super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                   ._M_head_impl,(FileDescriptorProto *)&gtest_ar_5.message_);
        psVar5 = FileDescriptorProto::syntax_abi_cxx11_((FileDescriptorProto *)&gtest_ar_5.message_)
        ;
        testing::internal::EqHelper::
        Compare<char[9],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  ((EqHelper *)local_848,"\"editions\"","other.syntax()",(char (*) [9])0x1e19efe,
                   psVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_848);
        if (!bVar1) {
          testing::Message::Message(&local_850);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_848);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x214,pcVar4);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_850);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_850);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_848);
        local_86c = FileDescriptorProto::edition((FileDescriptorProto *)&gtest_ar_5.message_);
        local_870 = EDITION_2023;
        testing::internal::EqHelper::
        Compare<google::protobuf::Edition,_google::protobuf::Edition,_nullptr>
                  ((EqHelper *)local_868,"other.edition()","EDITION_2023",&local_86c,&local_870);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_868);
        if (!bVar1) {
          testing::Message::Message(&local_878);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_868);
          testing::internal::AssertHelper::AssertHelper
                    (&local_880,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor_unittest.cc"
                     ,0x215,pcVar4);
          testing::internal::AssertHelper::operator=(&local_880,&local_878);
          testing::internal::AssertHelper::~AssertHelper(&local_880);
          testing::Message::~Message(&local_878);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_868);
        FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)&gtest_ar_5.message_);
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
      DescriptorPool::~DescriptorPool((DescriptorPool *)&file_2);
      if (gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        gtest_ar.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  FileDescriptorProto::~FileDescriptorProto((FileDescriptorProto *)local_168);
  return;
}

Assistant:

TEST_F(FileDescriptorTest, Edition) {
  FileDescriptorProto proto;
  proto.set_name("foo");
  {
    proto.set_syntax("proto2");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO2);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("proto3");
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_PROTO3);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("proto3", other.syntax());
    EXPECT_FALSE(other.has_edition());
  }
  {
    proto.set_syntax("editions");
    proto.set_edition(EDITION_2023);
    DescriptorPool pool;
    const FileDescriptor* file = pool.BuildFile(proto);
    ASSERT_TRUE(file != nullptr);
    EXPECT_EQ(FileDescriptorLegacy(file).edition(), Edition::EDITION_2023);
    FileDescriptorProto other;
    file->CopyTo(&other);
    EXPECT_EQ("editions", other.syntax());
    EXPECT_EQ(other.edition(), EDITION_2023);
  }
}